

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-strtok.c
# Opt level: O0

int run_test_strtok(void)

{
  int iVar1;
  bool local_8cc;
  bool local_8ca;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  char current_test [2048];
  char *tok_r;
  char *itr;
  size_t j;
  size_t i;
  size_t tests_len;
  size_t tokens_len;
  strtok_test_case tests [4];
  
  memcpy(&tokens_len,&DAT_0022cd60,0x40);
  tests_len = 0x12;
  i = 4;
  j = 0;
  itr = (char *)0x0;
  do {
    if (i <= j) {
      return 0;
    }
    if ((long)tests_len <= (long)itr) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-strtok.c"
              ,0x4d,"j","<","tokens_len",itr,"<",tests_len);
      abort();
    }
    snprintf((char *)&eval_a,0x800,"%s",tests[j - 1].sep);
    current_test._2040_8_ = uv__strtok((char *)&eval_a,tests[j].str,&tok_r);
    if (((char *)current_test._2040_8_ == (char *)0x0) || (tokens[(long)itr] == (char *)0x0)) {
LAB_001b80d1:
      local_8ca = (char *)current_test._2040_8_ == tokens[(long)itr] && current_test._2040_8_ == 0;
    }
    else {
      iVar1 = strcmp((char *)current_test._2040_8_,tokens[(long)itr]);
      local_8ca = true;
      if (iVar1 != 0) goto LAB_001b80d1;
    }
    if (!local_8ca) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-strtok.c"
              ,0x50,
              "(tok_r != ((void*)0) && tokens[j] != ((void*)0) && strcmp(tok_r, tokens[j]) == 0) || (tok_r == tokens[j] && tok_r == ((void*)0))"
              ,"!=","0",0,"!=",0);
      abort();
    }
    while (itr = itr + 1, current_test._2040_8_ != 0) {
      if ((long)tests_len <= (long)itr) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-strtok.c"
                ,0x53,"j","<","tokens_len",itr,"<",tests_len);
        abort();
      }
      current_test._2040_8_ = uv__strtok((char *)0x0,tests[j].str,&tok_r);
      if (((char *)current_test._2040_8_ == (char *)0x0) || (tokens[(long)itr] == (char *)0x0)) {
LAB_001b82a8:
        local_8cc = (char *)current_test._2040_8_ == tokens[(long)itr] && current_test._2040_8_ == 0
        ;
      }
      else {
        iVar1 = strcmp((char *)current_test._2040_8_,tokens[(long)itr]);
        local_8cc = true;
        if (iVar1 != 0) goto LAB_001b82a8;
      }
      if (!local_8cc) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-strtok.c"
                ,0x55,
                "(tok_r != ((void*)0) && tokens[j] != ((void*)0) && strcmp(tok_r, tokens[j]) == 0) || (tok_r == tokens[j] && tok_r == ((void*)0))"
                ,"!=","0",0,"!=",0);
        abort();
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

TEST_IMPL(strtok) {
  struct strtok_test_case tests[] = {
    { "abc", "" },
    { "abc.abf", "." },
    { "This;is.a:test:of=the/string\\tokenizer-function.", "\\/:;=-" },
    { "Hello This-is-a-nice.-string", " ." },
  };
  size_t tokens_len = ARRAY_SIZE(tokens);
  size_t tests_len = ARRAY_SIZE(tests);
  size_t i;
  size_t j;
  char* itr;
  char* tok_r;
  char current_test[2048];

  for (i = 0, j = 0; i < tests_len; i += 1) {
    ASSERT_LT(j, tokens_len);
    snprintf(current_test, sizeof(current_test), "%s", tests[i].str);
    tok_r = uv__strtok(current_test, tests[i].sep, &itr);
    ASSERT_STRCMP(tok_r, tokens[j]);
    j++;
    while (tok_r) {
      ASSERT_LT(j, tokens_len);
      tok_r = uv__strtok(NULL, tests[i].sep, &itr);
      ASSERT_STRCMP(tok_r, tokens[j]);
      j++;
    }
  }
  return 0;
}